

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  long lVar1;
  int *piVar2;
  int *in_RCX;
  FITSfile *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int unaff_retaddr;
  char *cptr;
  long nread;
  long nspace;
  long bufpos;
  long ntodo;
  long recend;
  long recstart;
  LONGLONG filepos;
  int ii;
  int *in_stack_ffffffffffffff88;
  int *__n;
  long in_stack_ffffffffffffff98;
  FITSfile *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  FITSfile *Fptr;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (*in_RCX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd((fitsfile *)cptr,unaff_retaddr,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    if ((long)in_RSI < 0x21c0) {
      if (*(int *)(*(long *)(in_RDI + 2) + 0x50) < 0) {
        ffldrc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar3,
               &in_stack_ffffffffffffffa0->filehandle);
      }
      lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x40) +
              *(long *)(*(long *)(in_RDI + 2) + 0x568 +
                       (long)*(int *)(*(long *)(in_RDI + 2) + 0x50) * 8) * -0xb40;
      piVar2 = (int *)(0xb40 - lVar1);
      while (in_RSI != (int *)0x0) {
        __n = piVar2;
        if ((long)in_RSI < (long)piVar2) {
          __n = in_RSI;
        }
        memcpy(in_RDX,(void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) +
                               (long)(*(int *)(*(long *)(in_RDI + 2) + 0x50) * 0xb40) + lVar1),
               (size_t)__n);
        in_RSI = (int *)((long)in_RSI - (long)__n);
        in_RDX = (FITSfile *)((long)__n + (long)in_RDX);
        *(long *)(*(long *)(in_RDI + 2) + 0x40) =
             (long)__n + *(long *)(*(long *)(in_RDI + 2) + 0x40);
        if (in_RSI != (int *)0x0) {
          ffldrc(in_stack_ffffffffffffffb8,(long)in_RSI,(int)((ulong)lVar1 >> 0x20),piVar2);
          lVar1 = 0;
          piVar2 = (int *)0xb40;
        }
      }
    }
    else {
      Fptr = *(FITSfile **)(*(long *)(in_RDI + 2) + 0x40);
      lVar1 = (long)Fptr / 0xb40;
      piVar2 = (int *)((long)((long)in_RSI + (long)((long)Fptr[-1].ageindex + 0x9f)) / 0xb40);
      for (local_2c = 0; local_2c < 0x28; local_2c = local_2c + 1) {
        if (((*(int *)(*(long *)(in_RDI + 2) + 0x6a8 + (long)local_2c * 4) != 0) &&
            (lVar1 <= *(long *)(*(long *)(in_RDI + 2) + 0x568 + (long)local_2c * 8))) &&
           (*(long *)(*(long *)(in_RDI + 2) + 0x568 + (long)local_2c * 8) <= (long)piVar2)) {
          ffbfwt(Fptr,(int)((ulong)lVar1 >> 0x20),piVar2);
        }
      }
      if (*(FITSfile **)(*(long *)(in_RDI + 2) + 0x48) != Fptr) {
        ffseek(in_RDX,(LONGLONG)in_stack_ffffffffffffff88);
      }
      ffread(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDX,in_stack_ffffffffffffff88);
      *(long *)(*(long *)(in_RDI + 2) + 0x48) = (long)&Fptr->filehandle + (long)in_RSI;
    }
    iVar3 = *in_RCX;
  }
  else {
    iVar3 = *in_RCX;
  }
  return iVar3;
}

Assistant:

int ffgbyt(fitsfile *fptr,    /* I - FITS file pointer             */
           LONGLONG nbytes,       /* I - number of bytes to read       */
           void *buffer,      /* O - buffer to read into           */
           int *status)       /* IO - error status                 */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  Read large blocks of data directly from disk;
  read smaller segments via intermediate IO buffers to improve efficiency.
*/
{
    int ii;
    LONGLONG filepos;
    long recstart, recend, ntodo, bufpos, nspace, nread;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    cptr = (char *)buffer;

    if (nbytes >= MINDIRECT)
    {
      /* read large blocks of data directly from disk instead of via buffers */
      filepos = (fptr->Fptr)->bytepos; /* save the read starting position */

/*  note that in this case, ffmbyt has not been called, and so        */
/*  bufrecnum[(fptr->Fptr)->curbuf] does not point to the intended */
/*  output buffer */

      recstart = (long) (filepos / IOBUFLEN);               /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->dirty[ii] && 
            (fptr->Fptr)->bufrecnum[ii] >= recstart && (fptr->Fptr)->bufrecnum[ii] <= recend)
            {
              ffbfwt(fptr->Fptr, ii, status);    /* flush modified buffer to disk */
            }
      }

       /* move to the correct read position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      ffread(fptr->Fptr, (long) nbytes, cptr, status); /* read the data */
      (fptr->Fptr)->io_pos = filepos + nbytes; /* update the file position */
    }
    else
    {
      /* read small chucks of data using the IO buffers for efficiency */

      if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
      {                              /* so reload the last one that was used */
        ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
      }

      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
                IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      ntodo =  (long) nbytes;
      while (ntodo)
      {
        nread  = minvalue(ntodo, nspace);

        /* copy bytes from IO buffer to user's buffer */
        memcpy(cptr, (fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, nread);
        ntodo -= nread;            /* decrement remaining number of bytes */
        cptr  += nread;
        (fptr->Fptr)->bytepos += nread;    /* increment file position pointer */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), REPORT_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }

    return(*status);
}